

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

void __thiscall internalJSONNode::Set(internalJSONNode *this,double val)

{
  NumberToString *in_RSI;
  json_string local_38;
  double local_18;
  double val_local;
  internalJSONNode *this_local;
  
  this->_type = '\x02';
  (this->_value)._number = val;
  local_18 = val;
  val_local = (double)this;
  NumberToString::_ftoa_abi_cxx11_(&local_38,in_RSI,(this->_value)._number);
  std::__cxx11::string::operator=((string *)&this->_string,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  SetFetched(this,true);
  return;
}

Assistant:

void internalJSONNode::Set(bool val) json_nothrow {
    makeNotContainer();
    _type = JSON_BOOL;
    _value._bool = val;
    #if(defined(JSON_CASTABLE) || !defined(JSON_LESS_MEMORY) || defined(JSON_WRITE_PRIORITY))
	   _string = val ? json_global(CONST_TRUE) : json_global(CONST_FALSE);
    #endif
    SetFetched(true);
}